

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateType(Catalog *this,CatalogTransaction transaction,CreateTypeInfo *info)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  SchemaCatalogEntry *pSVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  undefined8 extraout_RDX;
  undefined4 extraout_var;
  
  pSVar1 = GetSchema(this,transaction,&(info->super_CreateInfo).schema);
  UNRECOVERED_JUMPTABLE = (pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x1b]
  ;
  oVar2.ptr._0_4_ = (*UNRECOVERED_JUMPTABLE)(pSVar1,info,extraout_RDX,UNRECOVERED_JUMPTABLE);
  oVar2.ptr._4_4_ = extraout_var;
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateType(CatalogTransaction transaction, CreateTypeInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	return CreateType(transaction, schema, info);
}